

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O2

double __thiscall
crnlib::vec<16U,_float>::normalize(vec<16U,_float> *this,vec<16U,_float> *pDefaultVec)

{
  uint i;
  long lVar1;
  double __x;
  double dVar2;
  
  __x = (double)(this->m_s[0] * this->m_s[0]);
  for (lVar1 = 1; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    __x = __x + (double)(this->m_s[lVar1] * this->m_s[lVar1]);
  }
  if ((__x != 0.0) || (NAN(__x))) {
    if (__x < 0.0) {
      dVar2 = sqrt(__x);
    }
    else {
      dVar2 = SQRT(__x);
    }
    operator*=(this,(float)(1.0 / dVar2));
  }
  else if (pDefaultVec != (vec<16U,_float> *)0x0) {
    operator=(this,pDefaultVec);
  }
  return __x;
}

Assistant:

inline double normalize(const vec* pDefaultVec = nullptr) {
            double n = m_s[0] * m_s[0];
            for (uint i = 1; i < N; i++)
            {
                n += m_s[i] * m_s[i];
            }

            if (n != 0)
            {
                *this *= static_cast<T>((1.0f / sqrt(n)));
            }
            else if (pDefaultVec)
            {
                *this = *pDefaultVec;
            }
            return n;
        }